

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  Identifier IVar4;
  ulong uVar5;
  pool_ref<soul::heart::Block> *b;
  undefined8 *puVar6;
  ulong uVar7;
  long lVar8;
  Type local_48;
  
  std::
  _Hashtable<soul::pool_ref<const_soul::heart::Block>,_std::pair<const_soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Block>_>,_std::hash<soul::pool_ref<const_soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->blockMappings)._M_h);
  CodeLocation::operator=((CodeLocation *)(__fn + 8),(CodeLocation *)((long)__child_stack + 8));
  cloneType(&local_48,this,(Type *)((long)__child_stack + 0x18));
  Type::operator=((Type *)(__fn + 0x18),&local_48);
  RefCountedPtr<soul::Structure>::~RefCountedPtr
            ((RefCountedPtr<soul::Structure> *)((long)&local_48 + 0x10));
  IVar4 = Identifier::Pool::get
                    (&this->newModule->allocator->identifiers,
                     (Identifier *)((long)__child_stack + 0x30));
  *(string **)(__fn + 0x30) = IVar4.name;
  heart::FunctionType::operator=
            ((FunctionType *)(__fn + 0xd0),(FunctionType)*(Type *)((long)__child_stack + 0xd0));
  *(undefined4 *)(__fn + 0xb8) = *(undefined4 *)((long)__child_stack + 0xb8);
  __fn[0xd4] = *(code *)((long)__child_stack + 0xd4);
  __fn[0xd5] = *(code *)((long)__child_stack + 0xd5);
  Annotation::operator=((Annotation *)(__fn + 0x88),(Annotation *)((long)__child_stack + 0x88));
  lVar1 = *(long *)((long)__child_stack + 0x38);
  lVar2 = *(long *)((long)__child_stack + 0x40);
  for (lVar8 = 0; lVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    local_48._0_8_ = cloneVariable(this,*(Variable **)(lVar1 + lVar8));
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::push_back
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *)(__fn + 0x38),
               (pool_ref<soul::heart::Variable> *)&local_48);
  }
  puVar3 = *(undefined8 **)((long)__child_stack + 0x78);
  for (puVar6 = *(undefined8 **)((long)__child_stack + 0x70); puVar6 != puVar3; puVar6 = puVar6 + 1)
  {
    local_48._0_8_ = createNewBlock(this,(Block *)*puVar6);
    std::
    vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>::
    emplace_back<soul::pool_ref<soul::heart::Block>>
              ((vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
                *)(__fn + 0x70),(pool_ref<soul::heart::Block> *)&local_48);
  }
  uVar7 = 0;
  while( true ) {
    lVar1 = *(long *)(__fn + 0x70);
    uVar5 = *(long *)(__fn + 0x78) - lVar1 >> 3;
    if (uVar5 <= uVar7) break;
    clone(this,*(__fn **)(lVar1 + uVar7 * 8),
          *(void **)(*(long *)((long)__child_stack + 0x70) + uVar7 * 8),(int)uVar5,__arg);
    uVar7 = uVar7 + 1;
  }
  return (int)lVar1;
}

Assistant:

void clone (heart::Function& f, const heart::Function& old)
    {
        blockMappings.clear();

        f.location = old.location;
        f.returnType = cloneType (old.returnType);
        f.name = newModule.allocator.get (old.name);
        f.functionType = old.functionType;
        f.intrinsicType = old.intrinsicType;
        f.isExported = old.isExported;
        f.hasNoBody = old.hasNoBody;
        f.annotation = old.annotation;

        for (auto& p : old.parameters)
            f.parameters.push_back (cloneVariable (p));

        for (auto& b : old.blocks)
            f.blocks.push_back (createNewBlock (b));

        for (size_t i = 0; i < f.blocks.size(); ++i)
            clone (f.blocks[i], old.blocks[i]);
    }